

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O1

void __thiscall COLLADASaxFWL::KinematicAttachment::~KinematicAttachment(KinematicAttachment *this)

{
  pointer ppTVar1;
  
  (this->super_IntermediateTargetableTemplate<2UL>).super_IntermediateTargetable.
  _vptr_IntermediateTargetable = (_func_int **)&PTR__KinematicAttachment_00932a70;
  deleteVector<COLLADAFW::Transformation*>(&this->mTransformations);
  SidAddress::~SidAddress(&this->mJoint);
  ppTVar1 = (this->mTransformations).
            super__Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->mTransformations).
                                  super__Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  KinematicLink::~KinematicLink(&this->mLink);
  return;
}

Assistant:

~KinematicAttachment(){ deleteVector(mTransformations); }